

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

cmListFileBacktrace __thiscall cmGeneratorTarget::GetBacktrace(cmGeneratorTarget *this)

{
  size_t *psVar1;
  cmMakefile *pcVar2;
  cmListFileBacktrace *pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  cmListFileBacktrace cVar4;
  
  pcVar3 = cmTarget::GetBacktrace((cmTarget *)*in_RSI);
  this->Target = (cmTarget *)
                 (pcVar3->TopEntry).
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  pcVar2 = (cmMakefile *)
           (pcVar3->TopEntry).
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  this->Makefile = pcVar2;
  if (pcVar2 != (cmMakefile *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(pcVar2->FindPackageRootPathStack).
                super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(pcVar2->FindPackageRootPathStack).
                super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  cVar4.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  cVar4.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar4.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace cmGeneratorTarget::GetBacktrace() const
{
  return this->Target->GetBacktrace();
}